

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

PackedStructFieldDef * __thiscall
kratos::PortPackedStruct::get_definition(PortPackedStruct *this,string *name)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  reference __rhs;
  PackedStructFieldDef *def;
  iterator __end1;
  iterator __begin1;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range1;
  string *name_local;
  PortPackedStruct *this_local;
  
  peVar3 = std::__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->struct_);
  __end1 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ::begin(&peVar3->attributes);
  def = (PackedStructFieldDef *)
        std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
        end(&peVar3->attributes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                *)&def);
    if (!bVar1) {
      return (PackedStructFieldDef *)0x0;
    }
    __rhs = __gnu_cxx::
            __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
            ::operator*(&__end1);
    _Var2 = std::operator==(name,&__rhs->name);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
    ::operator++(&__end1);
  }
  return __rhs;
}

Assistant:

const PackedStructFieldDef* PortPackedStruct::get_definition(const std::string& name) const {
    for (auto const& def : struct_->attributes) {
        if (name == def.name) {
            return &def;
        }
    }
    return nullptr;
}